

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O2

void __thiscall KDReports::ImageElement::setImage(ImageElement *this,QImage *image)

{
  QSize QVar1;
  enable_if_t<std::is_copy_constructible_v<QImage>,_QVariant> eStack_38;
  
  QVariant::fromValue<QImage>(&eStack_38,image);
  QVariant::operator=(&((this->d)._M_t.
                        super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
                        .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl
                       )->m_pixmap,&eStack_38);
  QVariant::~QVariant(&eStack_38);
  QVar1 = (QSize)QImage::size();
  ((this->d)._M_t.
   super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
   ._M_t.
   super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
   .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl)->m_pixmapSize =
       QVar1;
  return;
}

Assistant:

void KDReports::ImageElement::setImage(const QImage &image)
{
    d->m_pixmap = QVariant::fromValue(image);
    d->m_pixmapSize = image.size();
}